

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_viscous(REF_DBL *state,REF_DBL *grad,REF_DBL turb,REF_DBL mach,REF_DBL re,
                REF_DBL reference_temp,REF_DBL *dir,REF_DBL *flux)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  REF_DBL qdot [3];
  REF_DBL tau [3] [3];
  double local_88 [4];
  double local_68 [10];
  
  dVar2 = *state;
  dVar3 = state[1];
  dVar4 = state[2];
  dVar5 = state[3];
  dVar6 = state[4];
  if (reference_temp <= 0.0) {
    dVar13 = 1.0;
  }
  else {
    auVar17._8_8_ = dVar6 * 1.4;
    auVar17._0_8_ = 0x405ba3d70a3d70a4;
    auVar18._8_8_ = dVar2;
    auVar18._0_8_ = reference_temp;
    auVar18 = divpd(auVar17,auVar18);
    dVar14 = auVar18._8_8_;
    if (dVar14 < 0.0) {
      dVar13 = sqrt(dVar14);
    }
    else {
      dVar13 = SQRT(dVar14);
    }
    dVar13 = ((auVar18._0_8_ + 1.0) / (auVar18._0_8_ + dVar14)) * dVar14 * dVar13;
  }
  dVar14 = 0.0;
  if (((0.0 < turb) && (0.0 < dVar2)) && (dVar15 = dVar13 / dVar2, 0.0 < dVar15)) {
    dVar14 = dVar15 * 1e+20;
    if (dVar14 <= -dVar14) {
      dVar14 = -dVar14;
    }
    if (dVar14 <= turb) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0xfb,
             "ref_phys_viscous",4,"eddy viscosity");
      return 4;
    }
    dVar14 = pow(turb / dVar15,3.0);
    dVar14 = turb * dVar2 * (dVar14 / (dVar14 + 357.91099999999994));
  }
  dVar15 = (dVar13 + dVar14) * (mach / re);
  pdVar1 = grad + 3;
  pdVar7 = local_68;
  lVar8 = 0;
  pdVar9 = pdVar1;
  pdVar10 = pdVar1;
  do {
    lVar12 = 0;
    pdVar11 = pdVar9;
    do {
      pdVar7[lVar12] = (pdVar10[lVar12] + *pdVar11) * dVar15;
      lVar12 = lVar12 + 1;
      pdVar11 = pdVar11 + 3;
    } while (lVar12 != 3);
    dVar16 = local_68[lVar8 * 4];
    lVar12 = 0;
    pdVar11 = pdVar1;
    do {
      dVar16 = dVar16 + *pdVar11 * dVar15 * -0.6666666666666666;
      pdVar11 = pdVar11 + 4;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x48);
    local_68[lVar8 * 4] = dVar16;
    lVar8 = lVar8 + 1;
    pdVar10 = pdVar10 + 3;
    pdVar7 = pdVar7 + 3;
    pdVar9 = pdVar9 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    local_88[lVar8] =
         ((((grad[lVar8 + 0xc] * dVar2 + grad[lVar8] * -dVar6) * 1.4) / dVar2) / dVar2) *
         (mach / re) * -(dVar14 / 0.35999999999999993 + dVar13 / 0.2879999999999999);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  *flux = 0.0;
  flux[1] = dir[2] * local_68[2] + *dir * local_68[0] + dir[1] * local_68[1];
  flux[2] = dir[2] * local_68[5] + *dir * local_68[3] + dir[1] * local_68[4];
  flux[3] = dir[2] * local_68[8] + *dir * local_68[6] + dir[1] * local_68[7];
  flux[4] = ((dVar5 * local_68[8] + dVar3 * local_68[6] + dVar4 * local_68[7]) - local_88[2]) *
            dir[2] + ((local_68[2] * dVar5 + local_68[0] * dVar3 + local_68[1] * dVar4) -
                     local_88[0]) * *dir +
                     ((local_68[5] * dVar5 + local_68[3] * dVar3 + local_68[4] * dVar4) -
                     local_88[1]) * dir[1];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_viscous(REF_DBL *state, REF_DBL *grad, REF_DBL turb,
                                    REF_DBL mach, REF_DBL re,
                                    REF_DBL reference_temp, REF_DBL *dir,
                                    REF_DBL *flux) {
  REF_DBL rho, u, v, w, p, mu, mu_t, t;
  REF_DBL gamma = 1.4;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL tau[3][3], qdot[3];
  REF_INT i, j, k;
  REF_DBL thermal_conductivity, dtdx;

  rho = state[0];
  u = state[1];
  v = state[2];
  w = state[3];
  p = state[4];
  t = gamma * p / rho;

  RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
  RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
  thermal_conductivity =
      -(mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
  mu += mu_t;

  mu *= mach / re;
  thermal_conductivity *= mach / re;

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      tau[i][j] = mu * (grad[j + 3 * (1 + i)] + grad[i + 3 * (1 + j)]);
    }
    for (k = 0; k < 3; k++) {
      tau[i][i] += (-2.0 / 3.0) * mu * grad[k + 3 * (1 + k)];
    }
  }

  for (i = 0; i < 3; i++) {
    /* t = gamma * p / rho quotient rule */
    dtdx = gamma * (grad[i + 3 * 4] * rho - p * grad[i + 3 * 0]) / rho / rho;
    qdot[i] = thermal_conductivity * dtdx;
  }

  flux[0] = 0.0;
  flux[1] = dir[0] * tau[0][0] + dir[1] * tau[0][1] + dir[2] * tau[0][2];
  flux[2] = dir[0] * tau[1][0] + dir[1] * tau[1][1] + dir[2] * tau[1][2];
  flux[3] = dir[0] * tau[2][0] + dir[1] * tau[2][1] + dir[2] * tau[2][2];
  flux[4] = dir[0] * (u * tau[0][0] + v * tau[0][1] + w * tau[0][2] - qdot[0]) +
            dir[1] * (u * tau[1][0] + v * tau[1][1] + w * tau[1][2] - qdot[1]) +
            dir[2] * (u * tau[2][0] + v * tau[2][1] + w * tau[2][2] - qdot[2]);

  return REF_SUCCESS;
}